

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

void __thiscall QRenderRule::QRenderRule(QRenderRule *this,QRenderRule *param_1)

{
  Data *pDVar1;
  QStyleSheetPaletteData *pQVar2;
  QStyleSheetBoxData *pQVar3;
  QStyleSheetBackgroundData *pQVar4;
  QStyleSheetBorderData *pQVar5;
  QStyleSheetOutlineData *pQVar6;
  QStyleSheetGeometryData *pQVar7;
  QStyleSheetPositionData *pQVar8;
  QStyleSheetImageData *pQVar9;
  
  this->features = param_1->features;
  QBrush::QBrush(&this->defaultBackground,&param_1->defaultBackground);
  QFont::QFont(&this->font,&param_1->font);
  this->hasFont = param_1->hasFont;
  pDVar1 = (param_1->styleHints).d;
  (param_1->styleHints).d = (Data *)0x0;
  (this->styleHints).d = pDVar1;
  pQVar2 = (param_1->pal).d.ptr;
  (param_1->pal).d.ptr = (QStyleSheetPaletteData *)0x0;
  (this->pal).d.ptr = pQVar2;
  pQVar3 = (param_1->b).d.ptr;
  (param_1->b).d.ptr = (QStyleSheetBoxData *)0x0;
  (this->b).d.ptr = pQVar3;
  pQVar4 = (param_1->bg).d.ptr;
  (param_1->bg).d.ptr = (QStyleSheetBackgroundData *)0x0;
  (this->bg).d.ptr = pQVar4;
  pQVar5 = (param_1->bd).d.ptr;
  (param_1->bd).d.ptr = (QStyleSheetBorderData *)0x0;
  (this->bd).d.ptr = pQVar5;
  pQVar6 = (param_1->ou).d.ptr;
  (param_1->ou).d.ptr = (QStyleSheetOutlineData *)0x0;
  (this->ou).d.ptr = pQVar6;
  pQVar7 = (param_1->geo).d.ptr;
  (param_1->geo).d.ptr = (QStyleSheetGeometryData *)0x0;
  (this->geo).d.ptr = pQVar7;
  pQVar8 = (param_1->p).d.ptr;
  (param_1->p).d.ptr = (QStyleSheetPositionData *)0x0;
  (this->p).d.ptr = pQVar8;
  pQVar9 = (param_1->img).d.ptr;
  (param_1->img).d.ptr = (QStyleSheetImageData *)0x0;
  (this->img).d.ptr = pQVar9;
  pQVar9 = (param_1->iconPtr).d.ptr;
  (param_1->iconPtr).d.ptr = (QStyleSheetImageData *)0x0;
  (this->iconPtr).d.ptr = pQVar9;
  this->clipset = param_1->clipset;
  QPainterPath::QPainterPath(&this->clipPath,&param_1->clipPath);
  return;
}

Assistant:

QRenderRule() : features(0), hasFont(false), pal(nullptr), b(nullptr), bg(nullptr), bd(nullptr), ou(nullptr), geo(nullptr), p(nullptr), img(nullptr), clipset(0) { }